

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

tuple<unsigned_short,_TileData::MatchType> __thiscall
optimized::UniqueTiles::addTile(UniqueTiles *this,Tile *tile,Palette *palette)

{
  MatchType MVar1;
  _Node_iterator<TileData,_true,_true> _Var2;
  Palette *in_RCX;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<TileData,_true,_true>,_bool> pVar3;
  __node_gen_type __node_gen;
  TileData newTile;
  TileData *local_38;
  TileData local_2c;
  
  TileData::TileData(&local_2c,(Tile *)palette,in_RCX);
  local_38 = (TileData *)tile;
  pVar3 = std::
          _Hashtable<TileData,TileData,std::allocator<TileData>,std::__detail::_Identity,std::equal_to<TileData>,std::hash<TileData>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<TileData_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<TileData,true>>>>
                    ((_Hashtable<TileData,TileData,std::allocator<TileData>,std::__detail::_Identity,std::equal_to<TileData>,std::hash<TileData>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)tile,&local_2c);
  _Var2 = pVar3.first.super__Node_iterator_base<TileData,_true>._M_cur;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    MVar1 = TileData::tryMatching
                      ((TileData *)
                       ((long)_Var2.super__Node_iterator_base<TileData,_true>._M_cur + 8),&local_2c)
    ;
  }
  else {
    local_38 = (TileData *)((long)_Var2.super__Node_iterator_base<TileData,_true>._M_cur + 8);
    *(short *)((long)_Var2.super__Node_iterator_base<TileData,_true>._M_cur + 0x1a) =
         (short)(*(int *)&tile[4]._png - tile[3].x >> 3);
    std::vector<TileData_const*,std::allocator<TileData_const*>>::emplace_back<TileData_const*>
              ((vector<TileData_const*,std::allocator<TileData_const*>> *)&tile[3].x,&local_38);
    MVar1 = EXACT;
  }
  *(MatchType *)&(this->tileset)._M_h._M_buckets = MVar1;
  *(undefined2 *)((long)&(this->tileset)._M_h._M_buckets + 4) =
       *(undefined2 *)((long)_Var2.super__Node_iterator_base<TileData,_true>._M_cur + 0x1a);
  return (tuple<unsigned_short,_TileData::MatchType>)
         (_Tuple_impl<0UL,_unsigned_short,_TileData::MatchType>)this;
}

Assistant:

std::tuple<uint16_t, TileData::MatchType> addTile(Png::TilesVisitor::Tile const &tile,
	                                                  Palette const &palette) {
		TileData newTile(tile, palette);
		auto [tileData, inserted] = tileset.insert(newTile);

		TileData::MatchType matchType = TileData::EXACT;
		if (inserted) {
			// Give the new tile the next available unique ID
			tileData->tileID = static_cast<uint16_t>(tiles.size());
			// Pointers are never invalidated!
			tiles.emplace_back(&*tileData);
		} else {
			matchType = tileData->tryMatching(newTile);
		}
		return {tileData->tileID, matchType};
	}